

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::WildcardPortConnectionSyntax::setChild
          (WildcardPortConnectionSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  Info *pIVar2;
  SyntaxNode *pSVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  
  if (index == 2) {
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar4 = pvVar8->field_0x2;
    NVar5.raw = (pvVar8->numFlags).raw;
    uVar6 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->star).kind = pvVar8->kind;
    (this->star).field_0x2 = uVar4;
    (this->star).numFlags = (NumericTokenFlags)NVar5.raw;
    (this->star).rawLen = uVar6;
    (this->star).info = pIVar2;
  }
  else if (index == 1) {
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar4 = pvVar8->field_0x2;
    NVar5.raw = (pvVar8->numFlags).raw;
    uVar6 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->dot).kind = pvVar8->kind;
    (this->dot).field_0x2 = uVar4;
    (this->dot).numFlags = (NumericTokenFlags)NVar5.raw;
    (this->dot).rawLen = uVar6;
    (this->dot).info = pIVar2;
  }
  else {
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar1 = *ppSVar9;
    uVar7 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar3 = pSVar1->parent;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         pSVar1->kind;
    *(undefined4 *)
     &(this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
         = uVar7;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         pSVar3;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
         = pSVar1->previewNode;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
         *(size_t *)(pSVar1 + 1);
    pSVar3 = pSVar1[1].previewNode;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar1[1].parent;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar3;
  }
  return;
}

Assistant:

void WildcardPortConnectionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: dot = child.token(); return;
        case 2: star = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}